

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io-util.cc
# Opt level: O3

bool tinyusdz::io::UnmapFile(MMapFileHandle *handle,string *err)

{
  int iVar1;
  bool bVar2;
  
  if ((handle->addr == (uint8_t *)0x0) || (handle->size == 0)) {
    bVar2 = false;
  }
  else {
    iVar1 = munmap(handle->addr,handle->size);
    bVar2 = true;
    if ((err != (string *)0x0) && (iVar1 != 0)) {
      ::std::__cxx11::string::append((char *)err);
    }
  }
  return bVar2;
}

Assistant:

bool UnmapFile(const MMapFileHandle &handle, std::string *err) {
#if TINYUSDZ_MMAP_SUPPORTED
#if defined(_WIN32)
  if (handle.addr && handle.size) {
    if (!UnmapViewOfFile(handle.addr)) {
      if (err) {
        (*err) += "warning: UnmapViewOfFile failed: " +
                  llama_format_win_err(GetLastError());
      }
      // May ok for now
      return true;
    }
  }

  return false;
#else  // !WIN32
  if (handle.addr && handle.size) {
    int ret = munmap(reinterpret_cast<void *>(handle.addr), size_t(handle.size));
    if (ret != 0) { // 0 = success
      if (err) {
        (*err) += "warning: munmap failed.";
      }
    }
    // ignore return code for now
    return true;
  }
  return false;
#endif
#else  // !TINYUSDZ_MMAP_SUPPORTED
  (void)handle;
  (void)err;
  return false;
#endif
}